

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphics_threaded.cpp
# Opt level: O3

CTextureHandle __thiscall
CGraphics_Threaded::LoadTextureRaw
          (CGraphics_Threaded *this,int Width,int Height,int Format,void *pData,int StoreFormat,
          int Flags)

{
  CConfig *pCVar1;
  void *dest;
  int iVar2;
  uint uVar3;
  long in_FS_OFFSET;
  CTextureCreateCommand local_68;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  pCVar1 = this->m_pConfig;
  if (pCVar1->m_DbgStress == 0) {
    iVar2 = this->m_FirstFreeTexture;
    this->m_FirstFreeTexture = this->m_aTextureIndices[iVar2];
    this->m_aTextureIndices[iVar2] = -1;
    local_68.super_CCommand.m_Cmd = 3;
    local_68.super_CCommand.m_pNext = (CCommand *)0x0;
    local_68.m_PixelSize = 0;
    local_68.m_Format = 2;
    if ((uint)Format < 3) {
      local_68.m_PixelSize = *(int *)(&DAT_001d53d8 + (ulong)(uint)Format * 4);
      local_68.m_Format = Format + 1;
    }
    local_68.m_StoreFormat = StoreFormat + 1;
    if (2 < (uint)StoreFormat) {
      local_68.m_StoreFormat = 2;
    }
    local_68.m_Flags = 0x11 - ((Flags & 2U) == 0);
    if (pCVar1->m_GfxTextureCompression != 0) {
      local_68.m_Flags = local_68.m_Flags | 2;
    }
    if (((Flags & 0xcU) != 0 || ((Flags & 1U) != 0 || pCVar1->m_GfxTextureQuality != 0)) ||
        (Flags & 0x10U) != 0) {
      uVar3 = local_68.m_Flags | 4;
      if ((Flags & 1U) == 0 && pCVar1->m_GfxTextureQuality == 0) {
        uVar3 = local_68.m_Flags;
      }
      local_68.m_Flags = uVar3 & 0xffffffe7 | 8;
      if ((Flags & 4U) == 0) {
        local_68.m_Flags = uVar3;
      }
      local_68.m_Flags = (Flags & 0x10U) * 2 | Flags & 8U | local_68.m_Flags;
    }
    uVar3 = Height * Width * local_68.m_PixelSize;
    local_68.m_Slot = iVar2;
    local_68.m_Width = Width;
    local_68.m_Height = Height;
    dest = mem_alloc(uVar3);
    mem_copy(dest,pData,uVar3);
    local_68.m_pData = dest;
    CCommandBuffer::AddCommand<CCommandBuffer::CTextureCreateCommand>
              (this->m_pCommandBuffer,&local_68);
  }
  else {
    iVar2 = (this->m_InvalidTexture).m_Id;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return (CTextureHandle)iVar2;
  }
  __stack_chk_fail();
}

Assistant:

IGraphics::CTextureHandle CGraphics_Threaded::LoadTextureRaw(int Width, int Height, int Format, const void *pData, int StoreFormat, int Flags)
{
	// don't waste memory on texture if we are stress testing
	if(m_pConfig->m_DbgStress)
		return m_InvalidTexture;

	// grab texture
	int Tex = m_FirstFreeTexture;
	m_FirstFreeTexture = m_aTextureIndices[Tex];
	m_aTextureIndices[Tex] = -1;

	CCommandBuffer::CTextureCreateCommand Cmd;
	Cmd.m_Slot = Tex;
	Cmd.m_Width = Width;
	Cmd.m_Height = Height;
	Cmd.m_PixelSize = CImageInfo::GetPixelSize(Format);
	Cmd.m_Format = ImageFormatToTexFormat(Format);
	Cmd.m_StoreFormat = ImageFormatToTexFormat(StoreFormat);


	// flags
	Cmd.m_Flags = CCommandBuffer::TEXFLAG_TEXTURE2D;
	if(Flags&IGraphics::TEXLOAD_NOMIPMAPS)
		Cmd.m_Flags |= CCommandBuffer::TEXFLAG_NOMIPMAPS;
	if(m_pConfig->m_GfxTextureCompression)
		Cmd.m_Flags |= CCommandBuffer::TEXFLAG_COMPRESSED;
	if(m_pConfig->m_GfxTextureQuality || Flags&TEXLOAD_NORESAMPLE)
		Cmd.m_Flags |= CCommandBuffer::TEXFLAG_QUALITY;
	if(Flags&IGraphics::TEXLOAD_ARRAY_256)
	{
		Cmd.m_Flags |= CCommandBuffer::TEXFLAG_TEXTURE3D;
		Cmd.m_Flags &= ~CCommandBuffer::TEXFLAG_TEXTURE2D;
	}
	if(Flags&IGraphics::TEXLOAD_MULTI_DIMENSION)
		Cmd.m_Flags |= CCommandBuffer::TEXFLAG_TEXTURE3D;
	if(Flags&IGraphics::TEXLOAD_LINEARMIPMAPS)
		Cmd.m_Flags |= CCommandBuffer::TEXTFLAG_LINEARMIPMAPS;


	// copy texture data
	int MemSize = Width*Height*Cmd.m_PixelSize;
	void *pTmpData = mem_alloc(MemSize);
	mem_copy(pTmpData, pData, MemSize);
	Cmd.m_pData = pTmpData;


	//
	m_pCommandBuffer->AddCommand(Cmd);

	return CreateTextureHandle(Tex);
}